

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

String * __thiscall asl::String::operator=(String *this,String *s)

{
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  
  if (s->_size == 0) {
    __src = &s->field_2;
  }
  else {
    __src = (anon_union_16_2_78e7fdac_for_String_2 *)(s->field_2)._str;
  }
  resize(this,s->_len,false,true);
  if (this->_size == 0) {
    __dest = &this->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  memcpy(__dest,__src,(long)this->_len);
  __dest->_space[this->_len] = '\0';
  return this;
}

Assistant:

String& operator=(const String& s) { assign(s.str(), s._len); return *this; }